

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void ActionUnserialize::
     SerReadWriteMany<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
               (ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *s,CAddress *args,
               CNetAddr *args_1,
               Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
               *args_2,int *args_3)

{
  HashVerifier<DataStream> *this;
  Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
  *__nbytes;
  long in_FS_OFFSET;
  uint32_t obj;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = args_2;
  CAddress::
  SerializationOps<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>,CAddress,ActionUnserialize>
            (args,s);
  CNetAddr::Unserialize<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>(args_1,s);
  Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
  ::Unserialize<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>
            ((Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              *)args_2,s);
  this = s->m_substream;
  DataStream::read(this->m_source,(int)&local_2c,(void *)0x4,(size_t)__nbytes);
  CSHA256::Write((CSHA256 *)this,(uchar *)&local_2c,4);
  *args_3 = local_2c;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }